

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_random.hpp
# Opt level: O1

uint std::uniform_int_distribution<unsigned_long>::
     _S_nd<unsigned_long,iutest::detail::iuRandom::Engine,unsigned_int>(Engine *__g,uint __range)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  
  uVar3 = __g->m_v1 << 0xb ^ __g->m_v1;
  __g->m_v1 = __g->m_v2;
  __g->m_v2 = __g->m_v3;
  uVar4 = __g->m_v4;
  __g->m_v3 = uVar4;
  uVar4 = uVar3 >> 8 ^ uVar4 >> 0x13 ^ uVar3 ^ uVar4;
  __g->m_v4 = uVar4;
  lVar5 = (ulong)uVar4 * (ulong)__range;
  if (((uint)lVar5 < __range) && ((uint)lVar5 < -__range % __range)) {
    uVar2 = (ulong)__g->m_v4;
    uVar4 = __g->m_v3;
    uVar3 = __g->m_v1;
    uVar7 = __g->m_v2;
    do {
      uVar6 = uVar7;
      uVar7 = uVar4;
      uVar3 = uVar3 << 0xb ^ uVar3;
      uVar4 = (uint)uVar2;
      uVar1 = uVar3 >> 8 ^ (uint)(uVar2 >> 0x13) ^ uVar3 ^ uVar4;
      uVar2 = (ulong)uVar1;
      lVar5 = uVar2 * __range;
      uVar3 = uVar6;
    } while ((uint)lVar5 < -__range % __range);
    __g->m_v1 = uVar6;
    __g->m_v2 = uVar7;
    __g->m_v3 = uVar4;
    __g->m_v4 = uVar1;
  }
  return (uint)((ulong)lVar5 >> 0x20);
}

Assistant:

result_type gen()
        {
            const unsigned int t = (m_v1 ^ (m_v1 << 11));
            m_v1 = m_v2;
            m_v2 = m_v3;
            m_v3 = m_v4;
            m_v4 = (m_v4 ^ (m_v4 >> 19)) ^ (t ^ (t >> 8));
            return m_v4;
        }